

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O0

Float<unsigned_int,_8,_23,_127,_3U>
tcu::Float<unsigned_int,_8,_23,_127,_3U>::constructBits
          (int sign,int exponent,StorageType mantissaBits)

{
  StorageType exponentBits;
  StorageType signBit;
  StorageType mantissaBits_local;
  int exponent_local;
  int sign_local;
  
  Float((Float<unsigned_int,_8,_23,_127,_3U> *)&exponent_local,
        (uint)(sign < 0) << 0x1f | (exponent + 0x7f) * 0x800000 | mantissaBits);
  return (Float<unsigned_int,_8,_23,_127,_3U>)exponent_local;
}

Assistant:

Float<StorageType, ExponentBits, MantissaBits, ExponentBias, Flags>
Float<StorageType, ExponentBits, MantissaBits, ExponentBias, Flags>::constructBits
	(int sign, int exponent, StorageType mantissaBits)
{
	const StorageType signBit		= sign < 0 ? 1 : 0;
	const StorageType exponentBits	= exponent + ExponentBias;

	DE_ASSERT(sign == +1 || sign == -1 );
	DE_ASSERT(exponentBits >> ExponentBits == 0);
	DE_ASSERT(mantissaBits >> MantissaBits == 0);

	return Float(StorageType((signBit << (ExponentBits+MantissaBits)) | (exponentBits << MantissaBits) | (mantissaBits)));
}